

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment_navxythetalat.cpp
# Opt level: O3

void __thiscall
EnvironmentNAVXYTHETALATTICE::PrecomputeActionswithBaseMotionPrimitive
          (EnvironmentNAVXYTHETALATTICE *this,
          vector<SBPL_xytheta_mprimitive,_std::allocator<SBPL_xytheta_mprimitive>_>
          *motionprimitiveV)

{
  vector<EnvNAVXYTHETALATAction_t_*,_std::allocator<EnvNAVXYTHETALATAction_t_*>_> *__s;
  pointer *ppsVar1;
  undefined8 *puVar2;
  pointer pSVar3;
  pointer psVar4;
  pointer psVar5;
  pointer psVar6;
  long lVar7;
  iterator __position;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  int iVar10;
  ulong uVar11;
  EnvNAVXYTHETALATAction_t **ppEVar12;
  ulong *puVar13;
  pointer pSVar14;
  EnvNAVXYTHETALATAction_t *pEVar15;
  long lVar16;
  long lVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  pointer pSVar21;
  double __x;
  double dVar22;
  double dVar23;
  double dVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  short sVar27;
  int iVar28;
  short sVar29;
  int iVar30;
  long local_140;
  undefined4 local_138;
  uint uStack_134;
  undefined4 uStack_12c;
  sbpl_xy_theta_pt_t local_128;
  double local_108;
  ulong uStack_100;
  double local_f8;
  double dStack_f0;
  EnvironmentNAVXYTHETALATTICE *local_e0;
  double local_d8;
  double dStack_d0;
  double local_c8;
  double local_b8;
  vector<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_> *local_a0;
  vector<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_> local_98;
  vector<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_> local_80;
  int local_68;
  int iStack_64;
  undefined8 uStack_60;
  undefined4 local_58;
  uint uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  double local_48;
  
  iVar10 = (this->EnvNAVXYTHETALATCfg).NumThetaDirs;
  uVar19 = (ulong)iVar10;
  auVar26._8_8_ = 0;
  auVar26._0_8_ = uVar19;
  uVar11 = SUB168(auVar26 * ZEXT816(0x18),0);
  uVar20 = uVar11 + 8;
  if (0xfffffffffffffff7 < uVar11) {
    uVar20 = 0xffffffffffffffff;
  }
  if (SUB168(auVar26 * ZEXT816(0x18),8) != 0) {
    uVar20 = 0xffffffffffffffff;
  }
  uVar18 = uVar19 * 8;
  if (iVar10 < 0) {
    uVar18 = 0xffffffffffffffff;
  }
  ppEVar12 = (EnvNAVXYTHETALATAction_t **)operator_new__(uVar18);
  (this->EnvNAVXYTHETALATCfg).ActionsV = ppEVar12;
  puVar13 = (ulong *)operator_new__(uVar20);
  __s = (vector<EnvNAVXYTHETALATAction_t_*,_std::allocator<EnvNAVXYTHETALATAction_t_*>_> *)
        (puVar13 + 1);
  *puVar13 = uVar19;
  if (iVar10 == 0) {
    (this->EnvNAVXYTHETALATCfg).PredActionsV = __s;
  }
  else {
    memset(__s,0,((uVar11 - 0x18) / 0x18) * 0x18 + 0x18);
    (this->EnvNAVXYTHETALATCfg).PredActionsV = __s;
    if (0 < iVar10) {
      local_a0 = &(this->EnvNAVXYTHETALATCfg).FootprintPolygon;
      pSVar14 = (motionprimitiveV->
                super__Vector_base<SBPL_xytheta_mprimitive,_std::allocator<SBPL_xytheta_mprimitive>_>
                )._M_impl.super__Vector_impl_data._M_start;
      pSVar21 = (motionprimitiveV->
                super__Vector_base<SBPL_xytheta_mprimitive,_std::allocator<SBPL_xytheta_mprimitive>_>
                )._M_impl.super__Vector_impl_data._M_finish;
      local_140 = 0;
      local_e0 = this;
      do {
        lVar16 = (long)pSVar21 - (long)pSVar14 >> 3;
        uVar20 = lVar16 * 0x6db6db6db6db6db7;
        auVar8._8_8_ = 0;
        auVar8._0_8_ = uVar20;
        uVar11 = SUB168(auVar8 * ZEXT816(0x68),0);
        uVar19 = uVar11 + 8;
        if (0xfffffffffffffff7 < uVar11) {
          uVar19 = 0xffffffffffffffff;
        }
        if (SUB168(auVar8 * ZEXT816(0x68),8) != 0) {
          uVar19 = 0xffffffffffffffff;
        }
        puVar13 = (ulong *)operator_new__(uVar19);
        *puVar13 = uVar20;
        if (pSVar21 != pSVar14) {
          lVar17 = 0;
          do {
            puVar2 = (undefined8 *)((long)puVar13 + lVar17 + 0x48);
            *puVar2 = 0;
            puVar2[1] = 0;
            puVar2 = (undefined8 *)((long)puVar13 + lVar17 + 0x38);
            *puVar2 = 0;
            puVar2[1] = 0;
            puVar2 = (undefined8 *)((long)puVar13 + lVar17 + 0x28);
            *puVar2 = 0;
            puVar2[1] = 0;
            puVar2 = (undefined8 *)((long)puVar13 + lVar17 + 0x18);
            *puVar2 = 0;
            puVar2[1] = 0;
            *(undefined8 *)((long)puVar13 + lVar17 + 0x58) = 0;
            lVar17 = lVar17 + 0x68;
          } while (lVar16 * -0x6db6db6db6db6da8 - lVar17 != 0);
        }
        (this->EnvNAVXYTHETALATCfg).ActionsV[local_140] = (EnvNAVXYTHETALATAction_t *)(puVar13 + 1);
        local_d8 = (this->EnvNAVXYTHETALATCfg).cellsize_m;
        dStack_d0 = 0.0;
        (*(this->super_DiscreteSpaceInformation)._vptr_DiscreteSpaceInformation[0x20])(this);
        pSVar3 = (motionprimitiveV->
                 super__Vector_base<SBPL_xytheta_mprimitive,_std::allocator<SBPL_xytheta_mprimitive>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        pSVar14 = (motionprimitiveV->
                  super__Vector_base<SBPL_xytheta_mprimitive,_std::allocator<SBPL_xytheta_mprimitive>_>
                  )._M_impl.super__Vector_impl_data._M_finish;
        pSVar21 = pSVar14;
        if (pSVar14 != pSVar3) {
          local_d8 = local_d8 * 0.0 + local_d8 * 0.5;
          uVar11 = 0;
          pSVar14 = pSVar3;
          dStack_d0 = local_d8;
          do {
            pEVar15 = (this->EnvNAVXYTHETALATCfg).ActionsV[local_140];
            pEVar15[uVar11].aind = (uchar)uVar11;
            pEVar15[uVar11].starttheta = (char)local_140;
            psVar4 = pSVar14[uVar11].intermptV.
                     super__Vector_base<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
            local_108 = psVar4[-1].theta;
            local_f8 = psVar4[-1].x;
            dStack_f0 = 0.0;
            dVar24 = psVar4[-1].y;
            local_b8 = cos(__x);
            local_48 = sin(__x);
            local_138 = SUB84(dVar24,0);
            uStack_134 = (uint)((ulong)dVar24 >> 0x20);
            uStack_54 = uStack_134 ^ 0x80000000;
            uStack_4c = 0x80000000;
            local_58 = local_138;
            uStack_50 = 0;
            local_c8 = sin(__x);
            dVar22 = cos(__x);
            dVar23 = (this->EnvNAVXYTHETALATCfg).cellsize_m;
            auVar25._0_8_ =
                 local_b8 * local_f8 + (double)CONCAT44(uStack_54,local_58) * local_48 + local_d8;
            auVar25._8_8_ = local_c8 * local_f8 + dVar22 * dVar24 + dStack_d0;
            lVar16 = -(ulong)(auVar25._8_8_ < 0.0);
            auVar9._8_8_ = dVar23;
            auVar9._0_8_ = dVar23;
            auVar26 = divpd(auVar25,auVar9);
            iVar28 = (int)auVar26._0_8_ - (uint)(auVar25._0_8_ < 0.0);
            iVar30 = (int)lVar16 + (int)auVar26._8_8_;
            iVar10 = (*(this->super_DiscreteSpaceInformation)._vptr_DiscreteSpaceInformation[0x21])
                               (__x + local_108,this);
            uStack_12c = (undefined4)((ulong)lVar16 >> 0x20);
            ppEVar12 = (this->EnvNAVXYTHETALATCfg).ActionsV;
            pEVar15 = ppEVar12[local_140];
            pEVar15[uVar11].endtheta = (char)iVar10;
            uStack_60._4_4_ = uStack_12c;
            local_68._0_1_ = (char)iVar28;
            iStack_64._0_1_ = (char)iVar30;
            pEVar15[uVar11].dX = (char)local_68;
            pEVar15[uVar11].dY = (char)iStack_64;
            local_68 = iVar28;
            iStack_64 = iVar30;
            if ((char)iStack_64 == '\0' && (char)local_68 == '\0') {
              dVar24 = (this->EnvNAVXYTHETALATCfg).timetoturn45degsinplace_secs;
              uStack_60._0_4_ = (int)lVar16;
              dVar23 = computeMinUnsignedAngleDiff(local_108,0.0);
              dVar24 = (ABS(dVar23) * dVar24 * 1000.0) / 0.7853981633974483;
              ppEVar12 = (this->EnvNAVXYTHETALATCfg).ActionsV;
              pEVar15 = ppEVar12[local_140];
            }
            else {
              sVar27 = (short)(char)local_68;
              sVar29 = (short)(char)iStack_64;
              uStack_60 = lVar16;
              dVar24 = ceil(SQRT((double)((int)(short)(sVar29 * sVar29) +
                                         (int)(short)(sVar27 * sVar27))) *
                            (((this->EnvNAVXYTHETALATCfg).cellsize_m * 1000.0) /
                            (this->EnvNAVXYTHETALATCfg).nominalvel_mpersecs));
            }
            pEVar15[uVar11].cost = (int)dVar24;
            psVar5 = pEVar15[uVar11].intersectingcellsV.
                     super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>._M_impl.
                     super__Vector_impl_data._M_start;
            if (pEVar15[uVar11].intersectingcellsV.
                super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>._M_impl.
                super__Vector_impl_data._M_finish != psVar5) {
              pEVar15[uVar11].intersectingcellsV.
              super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>._M_impl.
              super__Vector_impl_data._M_finish = psVar5;
              pEVar15 = ppEVar12[local_140];
            }
            psVar4 = pEVar15[uVar11].intermptV.
                     super__Vector_base<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            if (pEVar15[uVar11].intermptV.
                super__Vector_base<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>._M_impl.
                super__Vector_impl_data._M_finish != psVar4) {
              pEVar15[uVar11].intermptV.
              super__Vector_base<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>._M_impl.
              super__Vector_impl_data._M_finish = psVar4;
              pEVar15 = ppEVar12[local_140];
            }
            psVar6 = pEVar15[uVar11].interm3DcellsV.
                     super__Vector_base<sbpl_xy_theta_cell_t,_std::allocator<sbpl_xy_theta_cell_t>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            if (pEVar15[uVar11].interm3DcellsV.
                super__Vector_base<sbpl_xy_theta_cell_t,_std::allocator<sbpl_xy_theta_cell_t>_>.
                _M_impl.super__Vector_impl_data._M_finish != psVar6) {
              pEVar15[uVar11].interm3DcellsV.
              super__Vector_base<sbpl_xy_theta_cell_t,_std::allocator<sbpl_xy_theta_cell_t>_>.
              _M_impl.super__Vector_impl_data._M_finish = psVar6;
            }
            pSVar14 = (motionprimitiveV->
                      super__Vector_base<SBPL_xytheta_mprimitive,_std::allocator<SBPL_xytheta_mprimitive>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            uVar19 = ((long)(motionprimitiveV->
                            super__Vector_base<SBPL_xytheta_mprimitive,_std::allocator<SBPL_xytheta_mprimitive>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)pSVar14 >> 3) *
                     0x6db6db6db6db6db7;
            if (uVar19 < uVar11 || uVar19 - uVar11 == 0) {
LAB_001266ea:
              std::__throw_out_of_range_fmt
                        ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                         ,uVar11);
            }
            lVar16 = -1;
            lVar17 = 0;
            while( true ) {
              lVar7 = *(long *)&pSVar14[uVar11].intermptV.
                                super__Vector_base<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>
                                ._M_impl;
              lVar16 = lVar16 + 1;
              if ((int)((ulong)((long)pSVar14[uVar11].intermptV.
                                      super__Vector_base<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - lVar7) >> 3) *
                  -0x55555555 <= lVar16) break;
              dVar24 = *(double *)(lVar7 + lVar17);
              local_128.y = ((double *)(lVar7 + lVar17))[1];
              local_128.theta = *(double *)(lVar7 + 0x10 + lVar17);
              local_128.x = dVar24;
              local_b8 = cos(__x);
              local_108 = local_128.y;
              uStack_100 = 0;
              local_f8 = sin(__x);
              dVar23 = local_128.x;
              local_108 = -local_108;
              uStack_100 = uStack_100 ^ 0x8000000000000000;
              local_c8 = sin(__x);
              dStack_f0 = local_128.y;
              dVar22 = cos(__x);
              local_128.x = local_b8 * dVar24 + local_108 * local_f8;
              local_128.y = local_c8 * dVar23 + dVar22 * dStack_f0;
              local_128.theta = normalizeAngle(local_128.theta + __x);
              pEVar15 = (local_e0->EnvNAVXYTHETALATCfg).ActionsV[local_140];
              __position._M_current =
                   pEVar15[uVar11].intermptV.
                   super__Vector_base<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
              if (__position._M_current ==
                  pEVar15[uVar11].intermptV.
                  super__Vector_base<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage) {
                std::vector<sbpl_xy_theta_pt_t,std::allocator<sbpl_xy_theta_pt_t>>::
                _M_realloc_insert<sbpl_xy_theta_pt_t_const&>
                          ((vector<sbpl_xy_theta_pt_t,std::allocator<sbpl_xy_theta_pt_t>> *)
                           &pEVar15[uVar11].intermptV,__position,&local_128);
              }
              else {
                (__position._M_current)->theta = local_128.theta;
                (__position._M_current)->x = local_128.x;
                (__position._M_current)->y = local_128.y;
                ppsVar1 = &pEVar15[uVar11].intermptV.
                           super__Vector_base<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
                *ppsVar1 = *ppsVar1 + 1;
              }
              lVar17 = lVar17 + 0x18;
              pSVar14 = (motionprimitiveV->
                        super__Vector_base<SBPL_xytheta_mprimitive,_std::allocator<SBPL_xytheta_mprimitive>_>
                        )._M_impl.super__Vector_impl_data._M_start;
              uVar19 = ((long)(motionprimitiveV->
                              super__Vector_base<SBPL_xytheta_mprimitive,_std::allocator<SBPL_xytheta_mprimitive>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)pSVar14 >> 3) *
                       0x6db6db6db6db6db7;
              if (uVar19 < uVar11 || uVar19 - uVar11 == 0) goto LAB_001266ea;
            }
            std::vector<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>::vector(&local_98,local_a0);
            this = local_e0;
            std::vector<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>::vector
                      (&local_80,
                       &(local_e0->EnvNAVXYTHETALATCfg).ActionsV[local_140][uVar11].intermptV);
            get_2d_motion_cells(&local_98,&local_80,
                                &(this->EnvNAVXYTHETALATCfg).ActionsV[local_140][uVar11].
                                 intersectingcellsV,(this->EnvNAVXYTHETALATCfg).cellsize_m);
            if (local_80.super__Vector_base<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>
                ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_80.
                              super__Vector_base<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                              (long)local_80.
                                    super__Vector_base<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_80.
                                    super__Vector_base<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
            if (local_98.super__Vector_base<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_98.super__Vector_base<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                              (long)local_98.
                                    super__Vector_base<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_98.
                                    super__Vector_base<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
            }
            local_128.x = (double)(this->EnvNAVXYTHETALATCfg).ActionsV[local_140];
            iVar10 = (int)((EnvNAVXYTHETALATAction_t *)((long)local_128.x + uVar11 * 0x68))->
                          endtheta;
            local_128.x = (double)((long)local_128.x + uVar11 * 0x68);
            std::vector<EnvNAVXYTHETALATAction_t*,std::allocator<EnvNAVXYTHETALATAction_t*>>::
            emplace_back<EnvNAVXYTHETALATAction_t*>
                      ((vector<EnvNAVXYTHETALATAction_t*,std::allocator<EnvNAVXYTHETALATAction_t*>>
                        *)((this->EnvNAVXYTHETALATCfg).PredActionsV +
                          ((iVar10 >> 0x1f & (this->EnvNAVXYTHETALATCfg).NumThetaDirs) + iVar10)),
                       (EnvNAVXYTHETALATAction_t **)&local_128);
            uVar11 = uVar11 + 1;
            pSVar14 = (motionprimitiveV->
                      super__Vector_base<SBPL_xytheta_mprimitive,_std::allocator<SBPL_xytheta_mprimitive>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            pSVar21 = (motionprimitiveV->
                      super__Vector_base<SBPL_xytheta_mprimitive,_std::allocator<SBPL_xytheta_mprimitive>_>
                      )._M_impl.super__Vector_impl_data._M_finish;
          } while (uVar11 < (ulong)(((long)pSVar21 - (long)pSVar14 >> 3) * 0x6db6db6db6db6db7));
        }
        local_140 = local_140 + 1;
      } while (local_140 < (this->EnvNAVXYTHETALATCfg).NumThetaDirs);
      goto LAB_001266b8;
    }
  }
  pSVar14 = (motionprimitiveV->
            super__Vector_base<SBPL_xytheta_mprimitive,_std::allocator<SBPL_xytheta_mprimitive>_>).
            _M_impl.super__Vector_impl_data._M_start;
  pSVar21 = (motionprimitiveV->
            super__Vector_base<SBPL_xytheta_mprimitive,_std::allocator<SBPL_xytheta_mprimitive>_>).
            _M_impl.super__Vector_impl_data._M_finish;
LAB_001266b8:
  (this->EnvNAVXYTHETALATCfg).actionwidth =
       (int)((ulong)((long)pSVar21 - (long)pSVar14) >> 3) * -0x49249249;
  (*(this->super_DiscreteSpaceInformation)._vptr_DiscreteSpaceInformation[0x4b])(this);
  return;
}

Assistant:

void EnvironmentNAVXYTHETALATTICE::PrecomputeActionswithBaseMotionPrimitive(
    std::vector<SBPL_xytheta_mprimitive>* motionprimitiveV)
{
    SBPL_PRINTF("Pre-computing action data using base motion primitives...\n");
    EnvNAVXYTHETALATCfg.ActionsV = new EnvNAVXYTHETALATAction_t*[EnvNAVXYTHETALATCfg.NumThetaDirs];
    EnvNAVXYTHETALATCfg.PredActionsV = new std::vector<EnvNAVXYTHETALATAction_t*> [EnvNAVXYTHETALATCfg.NumThetaDirs];
    std::vector<sbpl_2Dcell_t> footprint;

    //iterate over source angles
    for (int tind = 0; tind < EnvNAVXYTHETALATCfg.NumThetaDirs; tind++) {
        SBPL_PRINTF("pre-computing for angle %d out of %d angles\n", tind, EnvNAVXYTHETALATCfg.NumThetaDirs);
        EnvNAVXYTHETALATCfg.ActionsV[tind] = new EnvNAVXYTHETALATAction_t[motionprimitiveV->size()];

        //compute sourcepose
        sbpl_xy_theta_pt_t sourcepose;
        sourcepose.x = DISCXY2CONT(0, EnvNAVXYTHETALATCfg.cellsize_m);
        sourcepose.y = DISCXY2CONT(0, EnvNAVXYTHETALATCfg.cellsize_m);
    sourcepose.theta = DiscTheta2ContNew(tind);
    //sourcepose.theta = DiscTheta2Cont(tind, EnvNAVXYTHETALATCfg.NumThetaDirs);

        //iterate over motion primitives
        for (size_t aind = 0; aind < motionprimitiveV->size(); aind++) {
            EnvNAVXYTHETALATCfg.ActionsV[tind][aind].aind = aind;
            EnvNAVXYTHETALATCfg.ActionsV[tind][aind].starttheta = tind;
            double mp_endx_m = motionprimitiveV->at(aind).intermptV[motionprimitiveV->at(aind).intermptV.size() - 1].x;
            double mp_endy_m = motionprimitiveV->at(aind).intermptV[motionprimitiveV->at(aind).intermptV.size() - 1].y;
            double mp_endtheta_rad =
                    motionprimitiveV->at(aind).intermptV[motionprimitiveV->at(aind).intermptV.size() - 1].theta;

            double endx = sourcepose.x + (mp_endx_m * cos(sourcepose.theta) - mp_endy_m * sin(sourcepose.theta));
            double endy = sourcepose.y + (mp_endx_m * sin(sourcepose.theta) + mp_endy_m * cos(sourcepose.theta));

            int endx_c = CONTXY2DISC(endx, EnvNAVXYTHETALATCfg.cellsize_m);
            int endy_c = CONTXY2DISC(endy, EnvNAVXYTHETALATCfg.cellsize_m);
        EnvNAVXYTHETALATCfg.ActionsV[tind][aind].endtheta = ContTheta2DiscNew(mp_endtheta_rad + sourcepose.theta);
        //EnvNAVXYTHETALATCfg.ActionsV[tind][aind].endtheta = ContTheta2Disc(mp_endtheta_rad + sourcepose.theta, EnvNAVXYTHETALATCfg.NumThetaDirs);
            EnvNAVXYTHETALATCfg.ActionsV[tind][aind].dX = endx_c;
            EnvNAVXYTHETALATCfg.ActionsV[tind][aind].dY = endy_c;

            if (EnvNAVXYTHETALATCfg.ActionsV[tind][aind].dY != 0 || EnvNAVXYTHETALATCfg.ActionsV[tind][aind].dX != 0)
                EnvNAVXYTHETALATCfg.ActionsV[tind][aind].cost = (int)(ceil(NAVXYTHETALAT_COSTMULT_MTOMM
                    * EnvNAVXYTHETALATCfg.cellsize_m / EnvNAVXYTHETALATCfg.nominalvel_mpersecs
                    * sqrt((double)(EnvNAVXYTHETALATCfg.ActionsV[tind][aind].dX
                        * EnvNAVXYTHETALATCfg.ActionsV[tind][aind].dX + EnvNAVXYTHETALATCfg.ActionsV[tind][aind].dY
                        * EnvNAVXYTHETALATCfg.ActionsV[tind][aind].dY))));
            else
                //cost of turn in place
                EnvNAVXYTHETALATCfg.ActionsV[tind][aind].cost = (int)(NAVXYTHETALAT_COSTMULT_MTOMM
                    * EnvNAVXYTHETALATCfg.timetoturn45degsinplace_secs
                    * fabs(computeMinUnsignedAngleDiff(mp_endtheta_rad, 0)) / (PI_CONST / 4.0));

            //compute and store interm points as well as intersecting cells
            EnvNAVXYTHETALATCfg.ActionsV[tind][aind].intersectingcellsV.clear();
            EnvNAVXYTHETALATCfg.ActionsV[tind][aind].intermptV.clear();
            EnvNAVXYTHETALATCfg.ActionsV[tind][aind].interm3DcellsV.clear();
            sbpl_xy_theta_cell_t previnterm3Dcell;
            previnterm3Dcell.theta = previnterm3Dcell.x = previnterm3Dcell.y = 0;

            for (int pind = 0; pind < (int)motionprimitiveV->at(aind).intermptV.size(); pind++) {
                sbpl_xy_theta_pt_t intermpt = motionprimitiveV->at(aind).intermptV[pind];

                //rotate it appropriately
                double rotx = intermpt.x * cos(sourcepose.theta) - intermpt.y * sin(sourcepose.theta);
                double roty = intermpt.x * sin(sourcepose.theta) + intermpt.y * cos(sourcepose.theta);
                intermpt.x = rotx;
                intermpt.y = roty;
                intermpt.theta = normalizeAngle(sourcepose.theta + intermpt.theta);

                //store it (they are with reference to 0,0,stattheta (not
                //sourcepose.x,sourcepose.y,starttheta (that is, half-bin))
                EnvNAVXYTHETALATCfg.ActionsV[tind][aind].intermptV.push_back(intermpt);
            }
            //now compute the intersecting cells for this motion (including ignoring the source footprint)
            get_2d_motion_cells(EnvNAVXYTHETALATCfg.FootprintPolygon,
                                EnvNAVXYTHETALATCfg.ActionsV[tind][aind].intermptV,
                                &EnvNAVXYTHETALATCfg.ActionsV[tind][aind].intersectingcellsV,
                                EnvNAVXYTHETALATCfg.cellsize_m);

#if DEBUG
            SBPL_FPRINTF(fDeb,
                         "action tind=%d aind=%d: dX=%d dY=%d endtheta=%d (%.2f degs -> %.2f degs) "
                         "cost=%d (mprim: %.2f %.2f %.2f)\n",
                         tind,
                         (int)aind,
                         EnvNAVXYTHETALATCfg.ActionsV[tind][aind].dX,
                         EnvNAVXYTHETALATCfg.ActionsV[tind][aind].dY,
                         EnvNAVXYTHETALATCfg.ActionsV[tind][aind].endtheta,
                         sourcepose.theta * 180.0 / PI_CONST,
                         EnvNAVXYTHETALATCfg.ActionsV[tind][aind].intermptV[EnvNAVXYTHETALATCfg.ActionsV[tind][aind].intermptV.size() - 1].theta * 180.0 / PI_CONST,
                         EnvNAVXYTHETALATCfg.ActionsV[tind][aind].cost,
                         mp_endx_m,
                         mp_endy_m,
                         mp_endtheta_rad);
#endif

            //add to the list of backward actions
            int targettheta = EnvNAVXYTHETALATCfg.ActionsV[tind][aind].endtheta;
            if (targettheta < 0) targettheta = targettheta + EnvNAVXYTHETALATCfg.NumThetaDirs;
            EnvNAVXYTHETALATCfg.PredActionsV[targettheta].push_back(&(EnvNAVXYTHETALATCfg.ActionsV[tind][aind]));
        }
    }

    //set number of actions
    EnvNAVXYTHETALATCfg.actionwidth = motionprimitiveV->size();

    //now compute replanning data
    ComputeReplanningData();

    SBPL_PRINTF("done pre-computing action data based on motion primitives\n");
}